

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

uint32_t re2::Prog::EmptyFlags(StringPiece *text,char *p)

{
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  uint uVar7;
  
  pcVar2 = text->data_;
  if (pcVar2 == p) {
    uVar3 = 5;
  }
  else {
    uVar3 = (uint)(p[-1] == '\n');
  }
  pcVar5 = pcVar2 + text->size_;
  if (pcVar5 == p) {
    uVar4 = uVar3 | 10;
  }
  else {
    uVar4 = uVar3;
    if ((p < pcVar5) && (uVar4 = uVar3 | 2, *p != '\n')) {
      uVar4 = uVar3;
    }
  }
  uVar3 = uVar4;
  if (pcVar2 != p || pcVar5 != p) {
    if (pcVar2 == p) {
      bVar1 = *p;
      uVar7 = uVar4 + 0x10;
      if ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) {
        uVar4 = uVar7;
      }
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar4 = uVar7;
      }
      uVar3 = uVar4;
      if (bVar1 == 0x5f) {
        uVar3 = uVar7;
      }
    }
    else {
      bVar1 = p[-1];
      bVar6 = (bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10) || (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
      if (pcVar5 != p) {
        bVar1 = *p;
        bVar6 = bVar6 != ((bVar1 == 0x5f || (byte)(bVar1 - 0x30) < 10) ||
                         (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a);
      }
      uVar3 = uVar4 + 0x10;
      if (!bVar6) {
        uVar3 = uVar4;
      }
    }
  }
  return uVar3 + (~uVar3 & 0x10) * 2;
}

Assistant:

const_pointer data() const { return data_; }